

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O1

bool __thiscall Kumu::Timestamp::Unarchive(Timestamp *this,MemIOReader *Reader)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  caltime local_34;
  
  if (Reader == (MemIOReader *)0x0) {
    __assert_fail("Reader",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                  ,0x3dd,"virtual bool Kumu::Timestamp::Unarchive(MemIOReader *)");
  }
  uVar3 = Reader->m_capacity;
  uVar5 = Reader->m_size;
  uVar1 = (ulong)uVar5 + 2;
  local_34.date.year = 0;
  if (uVar1 <= uVar3) {
    uVar2 = *(ushort *)(Reader->m_p + uVar5);
    Reader->m_size = uVar5 + 2;
    local_34.date.year = (i32_t)(ushort)(uVar2 << 8 | uVar2 >> 8);
  }
  bVar4 = false;
  if (uVar1 <= uVar3) {
    uVar5 = Reader->m_size + 1;
    if (uVar5 <= uVar3) {
      local_34.date.month = (i32_t)Reader->m_p[Reader->m_size];
      Reader->m_size = uVar5;
      uVar5 = Reader->m_size + 1;
      if (uVar5 <= uVar3) {
        local_34.date.day = (i32_t)Reader->m_p[Reader->m_size];
        Reader->m_size = uVar5;
        uVar5 = Reader->m_size + 1;
        if (uVar5 <= uVar3) {
          local_34.hour = (i32_t)Reader->m_p[Reader->m_size];
          Reader->m_size = uVar5;
          uVar5 = Reader->m_size + 1;
          if (uVar5 <= uVar3) {
            local_34.minute = (i32_t)Reader->m_p[Reader->m_size];
            Reader->m_size = uVar5;
            uVar5 = Reader->m_size + 1;
            if (uVar3 < uVar5) {
              bVar4 = false;
            }
            else {
              local_34.second = (i32_t)Reader->m_p[Reader->m_size];
              Reader->m_size = uVar5;
              uVar5 = Reader->m_size + 1;
              bVar4 = false;
              if (uVar5 <= uVar3) {
                Reader->m_size = uVar5;
                local_34.offset = 0;
                TAI::tai::operator=(&this->m_Timestamp,&local_34);
                this->m_TZOffsetMinutes = 0;
                bVar4 = true;
              }
            }
          }
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool
Kumu::Timestamp::Unarchive(MemIOReader* Reader)
{
  ui16_t year;
  ui8_t month, day, hour, minute, second, tick;

  assert(Reader);
  if ( ! Reader->ReadUi16BE(&year) ) return false;
  if ( ! Reader->ReadUi8(&month) ) return false;
  if ( ! Reader->ReadUi8(&day) ) return false;
  if ( ! Reader->ReadUi8(&hour) ) return false;
  if ( ! Reader->ReadUi8(&minute) ) return false;
  if ( ! Reader->ReadUi8(&second) ) return false;
  if ( ! Reader->ReadUi8(&tick) ) return false;
  SetComponents(year, month, day, hour, minute, second);
  return true;
}